

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# terminal_input_parser.cpp
# Opt level: O2

Output * __thiscall
ftxui::TerminalInputParser::ParseCursorReporting
          (Output *__return_storage_ptr__,TerminalInputParser *this,
          vector<int,_std::allocator<int>_> *arguments)

{
  undefined8 uVar1;
  pointer piVar2;
  Type TVar3;
  CursorReporting CVar4;
  
  piVar2 = (arguments->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if ((long)(arguments->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
            super__Vector_impl_data._M_finish - (long)piVar2 == 8) {
    uVar1 = *(undefined8 *)piVar2;
    CVar4.y = (int)uVar1;
    CVar4.x = (int)((ulong)uVar1 >> 0x20);
    (__return_storage_ptr__->field_1).cursor = CVar4;
    TVar3 = CURSOR_REPORTING;
  }
  else {
    TVar3 = SPECIAL;
  }
  __return_storage_ptr__->type = TVar3;
  return __return_storage_ptr__;
}

Assistant:

TerminalInputParser::Output TerminalInputParser::ParseCursorReporting(
    std::vector<int> arguments) {
  if (arguments.size() != 2)
    return SPECIAL;
  Output output(CURSOR_REPORTING);
  output.cursor.y = arguments[0];
  output.cursor.x = arguments[1];
  return output;
}